

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O1

int Wlc_NtkCountObjBits(Wlc_Ntk_t *p,Vec_Int_t *vPisNew)

{
  int iVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  
  if ((long)vPisNew->nSize < 1) {
    iVar1 = 0;
  }
  else {
    lVar2 = 0;
    iVar1 = 0;
    do {
      lVar4 = (long)vPisNew->pArray[lVar2];
      if ((lVar4 < 1) || (p->nObjsAlloc <= vPisNew->pArray[lVar2])) {
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      iVar5 = p->pObjs[lVar4].End - p->pObjs[lVar4].Beg;
      iVar3 = -iVar5;
      if (0 < iVar5) {
        iVar3 = iVar5;
      }
      iVar1 = iVar1 + iVar3 + 1;
      lVar2 = lVar2 + 1;
    } while (vPisNew->nSize != lVar2);
  }
  return iVar1;
}

Assistant:

int Wlc_NtkCountObjBits( Wlc_Ntk_t * p, Vec_Int_t * vPisNew )
{
    Wlc_Obj_t * pObj; 
    int i, Count = 0;
    Wlc_NtkForEachObjVec( vPisNew, p, pObj, i )
        Count += Wlc_ObjRange(pObj);
    return Count;
}